

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fovYRadians,float aspect,float zNear,float zFar,
          bool directX)

{
  undefined3 in_register_00000031;
  float fVar1;
  
  *(undefined1 (*) [64])__return_storage_ptr__->m_elements = ZEXT1264(ZEXT812(0));
  fVar1 = tanf(fovYRadians * 0.5);
  __return_storage_ptr__->m_elements[0] = (1.0 / fVar1) / aspect;
  __return_storage_ptr__->m_elements[5] = 1.0 / fVar1;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    __return_storage_ptr__->m_elements[10] = (zNear + zFar) / (zNear - zFar);
    fVar1 = ((zFar + zFar) * zNear) / (zNear - zFar);
  }
  else {
    __return_storage_ptr__->m_elements[10] = zFar / (zNear - zFar);
    fVar1 = (zNear * zFar) / (zNear - zFar);
  }
  __return_storage_ptr__->m_elements[0xe] = fVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fovYRadians, float aspect, float zNear, float zFar, bool directX )
{
	Matrix4f m; // zero matrix

	float yScale = 1.f / tanf( 0.5f * fovYRadians );
	float xScale = yScale / aspect;

	m( 0, 0 ) = xScale;
	m( 1, 1 ) = yScale;
	m( 3, 2 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = zFar / ( zNear - zFar );
		m( 2, 3 ) = zNear * zFar / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = ( zFar + zNear ) / ( zNear - zFar );
		m( 2, 3 ) = 2.f * zFar * zNear / ( zNear - zFar );
	}

	return m;
}